

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O1

int MPIABI_Status_f2c(MPIABI_Fint *f_status,MPIABI_Status *c_status)

{
  undefined8 uVar1;
  int iVar2;
  MPI_Status *mpi_status_ptr;
  
  iVar2 = MPI_Status_f2c();
  if (c_status != (MPIABI_Status *)0x0) {
    c_status->MPI_SOURCE = (c_status->mpi_status).status_OpenMPI.f0;
    uVar1 = *(undefined8 *)((long)&c_status->mpi_status + 4);
    c_status->MPI_TAG = (int)uVar1;
    c_status->MPI_ERROR = (int)((ulong)uVar1 >> 0x20);
  }
  return iVar2;
}

Assistant:

int MPIABI_Status_f2c(
  const MPIABI_Fint * f_status,
  MPIABI_Status * c_status
) {
  return MPI_Status_f2c(
    (const MPI_Fint *)(const WPI_Fint *)f_status,
    (MPI_Status *)(WPI_StatusPtr)c_status
  );
}